

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.h
# Opt level: O2

int32_t ra_get_index(roaring_array_t *ra,uint16_t x)

{
  int lenarray;
  int32_t iVar1;
  
  lenarray = ra->size;
  if (((long)lenarray != 0) && (ra->keys[(long)lenarray + -1] != x)) {
    iVar1 = binarySearch(ra->keys,lenarray,x);
    return iVar1;
  }
  return lenarray + -1;
}

Assistant:

inline int32_t ra_get_index(const roaring_array_t *ra, uint16_t x) {
    if ((ra->size == 0) || ra->keys[ra->size - 1] == x) return ra->size - 1;
    return binarySearch(ra->keys, (int32_t)ra->size, x);
}